

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

OrderByNullType __thiscall
duckdb::DBConfig::ResolveNullOrder(DBConfig *this,OrderType order_type,OrderByNullType null_type)

{
  DefaultOrderByNullType DVar1;
  uint uVar2;
  InternalException *this_00;
  undefined7 in_register_00000011;
  ulong uVar3;
  allocator local_39;
  string local_38;
  
  uVar3 = CONCAT71(in_register_00000011,null_type);
  if ((int)uVar3 == 1) {
    DVar1 = (this->options).default_null_order;
    uVar3 = CONCAT71(in_register_00000011,DVar1);
    uVar2 = (uint)DVar1;
    if (1 < uVar2 - 2) {
      if (uVar2 == 5) {
        uVar3 = (ulong)(order_type == ASCENDING | 2);
      }
      else {
        if (uVar2 != 4) {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string((string *)&local_38,"Unknown null order setting",&local_39)
          ;
          InternalException::InternalException(this_00,&local_38);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar3 = (ulong)(order_type == ASCENDING ^ 3);
      }
    }
  }
  return (OrderByNullType)uVar3;
}

Assistant:

OrderByNullType DBConfig::ResolveNullOrder(OrderType order_type, OrderByNullType null_type) const {
	if (null_type != OrderByNullType::ORDER_DEFAULT) {
		return null_type;
	}
	switch (options.default_null_order) {
	case DefaultOrderByNullType::NULLS_FIRST:
		return OrderByNullType::NULLS_FIRST;
	case DefaultOrderByNullType::NULLS_LAST:
		return OrderByNullType::NULLS_LAST;
	case DefaultOrderByNullType::NULLS_FIRST_ON_ASC_LAST_ON_DESC:
		return order_type == OrderType::ASCENDING ? OrderByNullType::NULLS_FIRST : OrderByNullType::NULLS_LAST;
	case DefaultOrderByNullType::NULLS_LAST_ON_ASC_FIRST_ON_DESC:
		return order_type == OrderType::ASCENDING ? OrderByNullType::NULLS_LAST : OrderByNullType::NULLS_FIRST;
	default:
		throw InternalException("Unknown null order setting");
	}
}